

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImGuiViewportP_*> *this;
  int *piVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiViewportP_conflict1 *viewport;
  ImGuiWindow_conflict *window;
  ImGuiViewportP *this_00;
  undefined1 auVar4 [16];
  ushort uVar5;
  ImGuiContext_conflict1 *ctx;
  ImGuiWindow_conflict *pIVar6;
  uint uVar7;
  ImGuiViewportP_conflict1 **ppIVar8;
  ImDrawList *pIVar9;
  ImGuiWindow_conflict **ppIVar10;
  ImGuiIO *pIVar11;
  ImDrawList **ppIVar12;
  int n;
  int iVar13;
  ulong uVar14;
  ImGuiWindow_conflict *pIVar15;
  int n_2;
  long lVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  ImRect IVar21;
  ImVec2 local_90;
  ImGuiWindow_conflict *windows_to_render_top_most [2];
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 mouse_cursor_uv [4];
  
  ctx = GImGui;
  if (GImGui->Initialized != false) {
    iVar13 = GImGui->FrameCountEnded;
    if (iVar13 != GImGui->FrameCount) {
      EndFrame();
      iVar13 = ctx->FrameCount;
    }
    ctx->FrameCountRendered = iVar13;
    (ctx->IO).MetricsRenderWindows = 0;
    CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
    this = &ctx->Viewports;
    for (iVar13 = 0; iVar13 != this->Size; iVar13 = iVar13 + 1) {
      ppIVar8 = ImVector<ImGuiViewportP_*>::operator[](this,iVar13);
      viewport = *ppIVar8;
      ImDrawDataBuilder::Clear(&viewport->DrawDataBuilder);
      if (viewport->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar9 = GetBackgroundDrawList(&viewport->super_ImGuiViewport);
        AddDrawListToDrawData((viewport->DrawDataBuilder).Layers,pIVar9);
      }
    }
    pIVar15 = ctx->NavWindowingTarget;
    if (pIVar15 == (ImGuiWindow_conflict *)0x0) {
      windows_to_render_top_most[0] = (ImGuiWindow_conflict *)0x0;
      pIVar15 = (ImGuiWindow_conflict *)0x0;
    }
    else {
      if ((pIVar15->Flags & 0x2000) == 0) {
        windows_to_render_top_most[0] = pIVar15->RootWindowDockTree;
      }
      else {
        windows_to_render_top_most[0] = (ImGuiWindow_conflict *)0x0;
      }
      pIVar15 = ctx->NavWindowingListWindow;
    }
    pIVar6 = windows_to_render_top_most[0];
    windows_to_render_top_most[1] = pIVar15;
    for (iVar13 = 0; iVar13 != (ctx->Windows).Size; iVar13 = iVar13 + 1) {
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                           ((ImVector<ImGuiWindow_*> *)&ctx->Windows,iVar13);
      window = *ppIVar10;
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar15 && window != pIVar6) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
    }
    for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
      pIVar15 = windows_to_render_top_most[lVar16];
      if (((pIVar15 != (ImGuiWindow_conflict *)0x0) && (pIVar15->Active == true)) &&
         (pIVar15->Hidden == false)) {
        AddRootWindowToDrawData(pIVar15);
      }
    }
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_90.x = 0.0;
    local_90.y = 0.0;
    mouse_cursor_uv[2].x = 0.0;
    mouse_cursor_uv[2].y = 0.0;
    mouse_cursor_uv[3].x = 0.0;
    mouse_cursor_uv[3].y = 0.0;
    mouse_cursor_uv[0].x = 0.0;
    mouse_cursor_uv[0].y = 0.0;
    mouse_cursor_uv[1].x = 0.0;
    mouse_cursor_uv[1].y = 0.0;
    if (((ctx->IO).MouseDrawCursor != false) && (ctx->MouseCursor != -1)) {
      ImFontAtlas::GetMouseCursorTexData
                ((ctx->IO).Fonts,ctx->MouseCursor,&local_70,&local_90,mouse_cursor_uv,
                 mouse_cursor_uv + 2);
    }
    (ctx->IO).MetricsRenderVertices = 0;
    (ctx->IO).MetricsRenderIndices = 0;
    for (iVar13 = 0; iVar13 < this->Size; iVar13 = iVar13 + 1) {
      ppIVar8 = ImVector<ImGuiViewportP_*>::operator[](this,iVar13);
      this_00 = (ImGuiViewportP *)*ppIVar8;
      ImDrawDataBuilder::FlattenIntoSingleLayer(&this_00->DrawDataBuilder);
      if ((0.0 < local_90.x) && (0.0 < local_90.y)) {
        local_68 = ZEXT416((uint)((ctx->Style).MouseCursorScale *
                                 (this_00->super_ImGuiViewport).DpiScale));
        IVar21 = ImGuiViewportP::GetMainRect(this_00);
        IVar2 = (ctx->IO).MousePos;
        fVar19 = IVar2.x;
        fVar20 = IVar2.y;
        uVar5 = -(ushort)(fVar20 < IVar21.Max.y);
        if (((uVar5 & 1) != 0) &&
           (((iVar17 = -(uint)(IVar21.Min.x < (float)local_68._0_4_ * (local_90.x + 2.0) + fVar19),
             iVar18 = -(uint)(IVar21.Min.y < (float)local_68._0_4_ * (local_90.y + 2.0) + fVar20),
             auVar4._4_4_ = iVar17, auVar4._0_4_ = iVar17, auVar4._8_4_ = iVar18,
             auVar4._12_4_ = iVar18, uVar7 = movmskpd((uint)uVar5,auVar4),
             (byte)((byte)uVar7 >> 1) != 0 && (fVar19 < IVar21.Max.x)) && ((uVar7 & 1) != 0)))) {
          pIVar9 = GetForegroundDrawList((ImGuiViewport *)this_00);
          RenderMouseCursor(pIVar9,(ctx->IO).MousePos,(float)local_68._0_4_,ctx->MouseCursor,
                            0xffffffff,0xff000000,0x30000000);
        }
      }
      if (this_00->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar9 = GetForegroundDrawList((ImGuiViewport *)this_00);
        AddDrawListToDrawData((this_00->DrawDataBuilder).Layers,pIVar9);
      }
      uVar7 = (this_00->super_ImGuiViewport).Flags;
      pIVar11 = GetIO();
      (this_00->super_ImGuiViewport).DrawData = &this_00->DrawDataP;
      (this_00->DrawDataP).Valid = true;
      uVar3 = (this_00->DrawDataBuilder).Layers[0].Size;
      if ((int)uVar3 < 1) {
        ppIVar12 = (ImDrawList **)0x0;
      }
      else {
        ppIVar12 = (this_00->DrawDataBuilder).Layers[0].Data;
      }
      (this_00->DrawDataP).TotalIdxCount = 0;
      (this_00->DrawDataP).TotalVtxCount = 0;
      (this_00->DrawDataP).CmdLists = ppIVar12;
      (this_00->DrawDataP).CmdListsCount = uVar3;
      (this_00->DrawDataP).DisplayPos = (this_00->super_ImGuiViewport).Pos;
      fVar19 = 0.0;
      fVar20 = 0.0;
      if ((uVar7 >> 10 & 1) == 0) {
        IVar2 = (this_00->super_ImGuiViewport).Size;
        fVar19 = IVar2.x;
        fVar20 = IVar2.y;
      }
      IVar2.y = fVar20;
      IVar2.x = fVar19;
      (this_00->DrawDataP).DisplaySize = IVar2;
      (this_00->DrawDataP).FramebufferScale = pIVar11->DisplayFramebufferScale;
      (this_00->DrawDataP).OwnerViewport = (ImGuiViewport *)this_00;
      iVar17 = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      iVar18 = 0;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        pIVar9 = (this_00->DrawDataBuilder).Layers[0].Data[uVar14];
        iVar18 = iVar18 + (pIVar9->VtxBuffer).Size;
        (this_00->DrawDataP).TotalVtxCount = iVar18;
        iVar17 = iVar17 + (pIVar9->IdxBuffer).Size;
        (this_00->DrawDataP).TotalIdxCount = iVar17;
      }
      piVar1 = &(ctx->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar18;
      piVar1 = &(ctx->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar17;
    }
    CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1297,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}